

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexmetadata.cpp
# Opt level: O0

void __thiscall
QHexMetadata::clearMetadata(QHexMetadata *this,qint64 line,ClearMetadataCallback *cb)

{
  iterator iVar1;
  size_t this_00;
  bool bVar2;
  QList<QHexMetadataItem> *pQVar3;
  QHexMetadataItem *pQVar4;
  const_iterator local_68;
  QHexMetadataItem *local_60;
  QHexMetadataItem *local_58;
  iterator local_50;
  iterator it;
  qsizetype oldsize;
  undefined1 local_30 [8];
  iterator iit;
  ClearMetadataCallback *cb_local;
  qint64 line_local;
  QHexMetadata *this_local;
  
  iit.i.bucket = (size_t)cb;
  cb_local = (ClearMetadataCallback *)line;
  line_local = (qint64)this;
  _local_30 = (piter)QHash<long_long,_QList<QHexMetadataItem>_>::find
                               (&this->m_metadata,(longlong *)&cb_local);
  _oldsize = (piter)QHash<long_long,_QList<QHexMetadataItem>_>::end(&this->m_metadata);
  bVar2 = QHash<long_long,_QList<QHexMetadataItem>_>::iterator::operator==
                    ((iterator *)local_30,(iterator *)&oldsize);
  if (!bVar2) {
    pQVar3 = QHash<long_long,_QList<QHexMetadataItem>_>::iterator::operator->((iterator *)local_30);
    it.i = (QHexMetadataItem *)QList<QHexMetadataItem>::size(pQVar3);
    pQVar3 = QHash<long_long,_QList<QHexMetadataItem>_>::iterator::operator->((iterator *)local_30);
    local_50 = QList<QHexMetadataItem>::begin(pQVar3);
    while( true ) {
      pQVar3 = QHash<long_long,_QList<QHexMetadataItem>_>::iterator::operator->
                         ((iterator *)local_30);
      local_58 = (QHexMetadataItem *)QList<QHexMetadataItem>::end(pQVar3);
      bVar2 = QList<QHexMetadataItem>::iterator::operator!=(&local_50,(iterator)local_58);
      this_00 = iit.i.bucket;
      if (!bVar2) break;
      pQVar4 = QList<QHexMetadataItem>::iterator::operator*(&local_50);
      bVar2 = std::function<bool_(QHexMetadataItem_&)>::operator()
                        ((function<bool_(QHexMetadataItem_&)> *)this_00,pQVar4);
      if (bVar2) {
        pQVar3 = QHash<long_long,_QList<QHexMetadataItem>_>::iterator::operator->
                           ((iterator *)local_30);
        QList<QHexMetadataItem>::const_iterator::const_iterator(&local_68,local_50);
        local_60 = (QHexMetadataItem *)QList<QHexMetadataItem>::erase(pQVar3,local_68);
        local_50 = (iterator)local_60;
      }
      else {
        QList<QHexMetadataItem>::iterator::operator++(&local_50,0);
      }
    }
    pQVar3 = QHash<long_long,_QList<QHexMetadataItem>_>::iterator::operator->((iterator *)local_30);
    bVar2 = QList<QHexMetadataItem>::empty(pQVar3);
    iVar1 = it;
    if (bVar2) {
      removeMetadata(this,(qint64)cb_local);
    }
    else {
      pQVar3 = QHash<long_long,_QList<QHexMetadataItem>_>::iterator::operator->
                         ((iterator *)local_30);
      pQVar4 = (QHexMetadataItem *)QList<QHexMetadataItem>::size(pQVar3);
      if (iVar1.i != pQVar4) {
        changed(this);
      }
    }
  }
  return;
}

Assistant:

void QHexMetadata::clearMetadata(qint64 line, ClearMetadataCallback&& cb) {
    auto iit = m_metadata.find(line);
    if(iit == m_metadata.end())
        return;

    auto oldsize = iit->size();

    for(auto it = iit->begin(); it != iit->end();) {
        if(cb(*it))
            it = iit->erase(it);
        else
            it++;
    }

    if(iit->empty()) {
        this->removeMetadata(line);
        return;
    }

    if(oldsize != iit->size())
        Q_EMIT changed();
}